

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

DecodeRawTransactionTxInStruct * __thiscall
cfd::js::api::json::DecodeRawTransactionTxIn::ConvertToStruct
          (DecodeRawTransactionTxInStruct *__return_storage_ptr__,DecodeRawTransactionTxIn *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  DecodeUnlockingScriptStruct local_a0;
  undefined1 local_19;
  DecodeRawTransactionTxIn *local_18;
  DecodeRawTransactionTxIn *this_local;
  DecodeRawTransactionTxInStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (DecodeRawTransactionTxIn *)__return_storage_ptr__;
  DecodeRawTransactionTxInStruct::DecodeRawTransactionTxInStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->coinbase_);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->txid,(string *)&this->txid_);
  __return_storage_ptr__->vout = this->vout_;
  DecodeUnlockingScript::ConvertToStruct(&local_a0,&this->script_sig_);
  DecodeUnlockingScriptStruct::operator=(&__return_storage_ptr__->script_sig,&local_a0);
  DecodeUnlockingScriptStruct::~DecodeUnlockingScriptStruct(&local_a0);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct(&local_b8,&this->txinwitness_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->txinwitness,&local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  __return_storage_ptr__->sequence = this->sequence_;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

DecodeRawTransactionTxInStruct DecodeRawTransactionTxIn::ConvertToStruct() const {  // NOLINT
  DecodeRawTransactionTxInStruct result;
  result.coinbase = coinbase_;
  result.txid = txid_;
  result.vout = vout_;
  result.script_sig = script_sig_.ConvertToStruct();
  result.txinwitness = txinwitness_.ConvertToStruct();
  result.sequence = sequence_;
  result.ignore_items = ignore_items;
  return result;
}